

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heavylight2.cpp
# Opt level: O0

int dfs_numbering(int v,int t)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  reference this;
  reference piVar4;
  iterator iStack_28;
  int s;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  int t_local;
  int v_local;
  
  __range1._0_4_ = t + 1;
  __range1._4_4_ = v;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&in,(long)v);
  *pvVar3 = t + 1;
  std::vector<int,_std::allocator<int>_>::push_back(&et,(value_type *)((long)&__range1 + 4));
  this = std::
         vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ::operator[](&G,(long)__range1._4_4_);
  __end1 = std::vector<int,_std::allocator<int>_>::begin(this);
  iStack_28 = std::vector<int,_std::allocator<int>_>::end(this);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd8);
    iVar1 = (int)__range1;
    if (!bVar2) break;
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    __range1._0_4_ = dfs_numbering(*piVar4,(int)__range1);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&out,(long)__range1._4_4_);
  *pvVar3 = iVar1;
  return iVar1;
}

Assistant:

int dfs_numbering(int v = 0, int t = -1) {
	in[v] = ++t, et.push_back(v);
	for (auto s: G[v])
		t = dfs_numbering(s, t);
	return out[v] = t;
}